

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_none_md5sum(uchar *input,size_t inputlen,uchar *md5sum,size_t md5len)

{
  uint len;
  MD5_context *context;
  MD5_context *MD5pw;
  size_t md5len_local;
  uchar *md5sum_local;
  size_t inputlen_local;
  uchar *input_local;
  
  context = Curl_MD5_init(Curl_DIGEST_MD5);
  if (context == (MD5_context *)0x0) {
    input_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    len = curlx_uztoui(inputlen);
    Curl_MD5_update(context,input,len);
    Curl_MD5_final(context,md5sum);
    input_local._4_4_ = CURLE_OK;
  }
  return input_local._4_4_;
}

Assistant:

CURLcode Curl_none_md5sum(unsigned char *input, size_t inputlen,
                          unsigned char *md5sum, size_t md5len UNUSED_PARAM)
{
  MD5_context *MD5pw;

  (void)md5len;

  MD5pw = Curl_MD5_init(Curl_DIGEST_MD5);
  if(!MD5pw)
    return CURLE_OUT_OF_MEMORY;
  Curl_MD5_update(MD5pw, input, curlx_uztoui(inputlen));
  Curl_MD5_final(MD5pw, md5sum);
  return CURLE_OK;
}